

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

StringRef __thiscall llvm::sys::path::extension(path *this,StringRef path,Style style)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  StringRef SVar5;
  undefined1 auStack_48 [8];
  reverse_iterator I;
  
  I.Path.Data = path.Data;
  I.Path.Length = 0;
  I.Component.Data = (char *)0x0;
  I.Position._0_4_ = (undefined4)path.Length;
  auStack_48 = (undefined1  [8])this;
  I.Component.Length = (size_t)I.Path.Data;
  reverse_iterator::operator++((reverse_iterator *)auStack_48);
  pcVar2 = I.Component.Data;
  do {
    pcVar4 = pcVar2 + -1;
    if (pcVar2 == (char *)0x0) {
      pcVar4 = (char *)0xffffffffffffffff;
      break;
    }
    pcVar1 = pcVar2 + (I.Path.Length - 1);
    pcVar2 = pcVar4;
  } while (*pcVar1 != '.');
  if (pcVar4 == (char *)0xffffffffffffffff) {
LAB_00db3624:
    sVar3 = 0;
    pcVar2 = (char *)0x0;
  }
  else {
    if (I.Component.Data == (char *)0x2) {
      if (*(short *)I.Path.Length == 0x2e2e) goto LAB_00db3624;
    }
    else if (I.Component.Data == (char *)0x1) {
      sVar3 = 0;
      pcVar2 = (char *)0x0;
      if (*(char *)I.Path.Length == '.') goto LAB_00db3628;
    }
    if (I.Component.Data < pcVar4) {
      pcVar4 = I.Component.Data;
    }
    pcVar2 = pcVar4 + I.Path.Length;
    sVar3 = (long)I.Component.Data - (long)pcVar4;
  }
LAB_00db3628:
  SVar5.Length = sVar3;
  SVar5.Data = pcVar2;
  return SVar5;
}

Assistant:

StringRef extension(StringRef path, Style style) {
  StringRef fname = filename(path, style);
  size_t pos = fname.find_last_of('.');
  if (pos == StringRef::npos)
    return StringRef();
  else
    if ((fname.size() == 1 && fname == ".") ||
        (fname.size() == 2 && fname == ".."))
      return StringRef();
    else
      return fname.substr(pos);
}